

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O0

void anon_unknown.dwarf_2cda0::compail_fail
               (int id,string *defines,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors,string *code)

{
  _Bit_iterator __first;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *__command;
  istream *piVar5;
  string *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  int in_EDI;
  reference rVar6;
  iterator iVar7;
  _Bit_iterator _Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  int MAX_ERROR_LINES_COUNT;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rgx;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int i;
  string line;
  int lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  vector<bool,_std::allocator<bool>_> matches;
  file<std::basic_ifstream<char,_std::char_traits<char>_>_> output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> include;
  regex include_rgx;
  stringstream errors_1;
  file<std::basic_ofstream<char,_std::char_traits<char>_>_> source_code;
  stringstream command;
  _Bit_iterator_base *in_stack_fffffffffffff3c8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffff3d0;
  undefined7 in_stack_fffffffffffff3d8;
  undefined1 in_stack_fffffffffffff3df;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3e0;
  vector<bool,_std::allocator<bool>_> *this;
  undefined4 in_stack_fffffffffffff3e8;
  undefined4 in_stack_fffffffffffff3ec;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffff3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff408;
  undefined4 in_stack_fffffffffffff410;
  match_flag_type in_stack_fffffffffffff414;
  undefined4 in_stack_fffffffffffff418;
  undefined2 in_stack_fffffffffffff41c;
  byte in_stack_fffffffffffff41e;
  undefined1 in_stack_fffffffffffff41f;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffff420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff428;
  string local_b30 [32];
  reference local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b08;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b00;
  undefined1 *local_af8;
  _Bit_type *local_af0;
  uint local_ae8;
  _Bit_type *local_ae0;
  uint local_ad8;
  _Bit_type *local_ad0;
  uint local_ac8;
  undefined1 local_ab9;
  _Bit_type *local_ab8;
  uint local_ab0;
  _Bit_type *local_aa8;
  uint local_aa0;
  _Bit_type *local_a98;
  uint local_a90;
  _Bit_type *local_a88;
  uint local_a80;
  _Bit_type *local_a78;
  uint local_a70;
  string local_a68 [36];
  undefined4 local_a44;
  reference local_a40 [3];
  reference local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a08;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_9f8;
  int local_9ec;
  string local_9e8 [36];
  int local_9c4;
  undefined1 local_9c0 [31];
  undefined1 local_9a1;
  vector<bool,_std::allocator<bool>_> local_9a0;
  string local_978 [39];
  allocator local_951;
  string local_950 [32];
  string local_930 [32];
  string local_910 [32];
  istream local_8f0 [127];
  undefined1 in_stack_fffffffffffff78f;
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [64];
  stringstream local_5e8 [16];
  ostream local_5d8 [376];
  string local_460 [55];
  allocator local_429;
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  ostream local_3c8 [248];
  string local_2d0 [296];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  string *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  int local_4;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_4 = in_EDI;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"error",&local_429);
  std::__cxx11::to_string
            (CONCAT13(in_stack_fffffffffffff41f,
                      CONCAT12(in_stack_fffffffffffff41e,in_stack_fffffffffffff41c)));
  std::operator+(in_stack_fffffffffffff408,in_stack_fffffffffffff400);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
                 (char *)in_stack_fffffffffffff3d0);
  file<std::basic_ofstream<char,_std::char_traits<char>_>_>::file
            ((file<std::basic_ofstream<char,_std::char_traits<char>_>_> *)in_stack_fffffffffffff3e0,
             (string *)CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8));
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  poVar4 = std::operator<<(local_3c8,"#include <boost/di.hpp>");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_3c8,"namespace di = boost::di;");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_3c8,local_20);
  std::__cxx11::stringstream::stringstream(local_5e8);
  std::operator<<(local_5d8,"-Werror");
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
             (char *)in_stack_fffffffffffff408,(flag_type)((ulong)in_stack_fffffffffffff400 >> 0x20)
            );
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (in_stack_fffffffffffff428,in_stack_fffffffffffff420,
             (char *)CONCAT17(in_stack_fffffffffffff41f,
                              CONCAT16(in_stack_fffffffffffff41e,
                                       CONCAT24(in_stack_fffffffffffff41c,in_stack_fffffffffffff418)
                                      )),in_stack_fffffffffffff414);
  cxx_abi_cxx11_();
  poVar4 = std::operator<<(local_198,local_648);
  poVar4 = std::operator<<(poVar4," ");
  cxxflags_abi_cxx11_((bool)in_stack_fffffffffffff78f);
  poVar4 = std::operator<<(poVar4,local_668);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,local_628);
  poVar4 = std::operator<<(poVar4," ");
  std::__cxx11::stringstream::str();
  poVar4 = std::operator<<(poVar4,local_688);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,local_2d0);
  poVar4 = std::operator<<(poVar4," 2>");
  poVar4 = std::operator<<(poVar4," error");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_4);
  std::operator<<(poVar4,".out");
  std::__cxx11::string::~string(local_688);
  std::__cxx11::string::~string(local_668);
  std::__cxx11::string::~string(local_648);
  std::__cxx11::string::~string(local_628);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (in_stack_fffffffffffff3d0);
  std::__cxx11::stringstream::~stringstream(local_5e8);
  file<std::basic_ofstream<char,_std::char_traits<char>_>_>::~file
            ((file<std::basic_ofstream<char,_std::char_traits<char>_>_> *)in_stack_fffffffffffff3d0)
  ;
  std::__cxx11::stringstream::str();
  poVar4 = std::operator<<((ostream *)&std::clog,local_6a8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_6a8);
  std::__cxx11::stringstream::str();
  __command = (char *)std::__cxx11::string::c_str();
  iVar3 = system(__command);
  if (iVar3 == 0) {
    expect_fail__((char *)in_stack_fffffffffffff3d0,(char *)in_stack_fffffffffffff3c8,0);
  }
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_950,"error",&local_951);
  std::__cxx11::to_string
            (CONCAT13(in_stack_fffffffffffff41f,
                      CONCAT12(in_stack_fffffffffffff41e,in_stack_fffffffffffff41c)));
  std::operator+(in_stack_fffffffffffff408,in_stack_fffffffffffff400);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
                 (char *)in_stack_fffffffffffff3d0);
  file<std::basic_ifstream<char,_std::char_traits<char>_>_>::file
            ((file<std::basic_ifstream<char,_std::char_traits<char>_>_> *)in_stack_fffffffffffff3e0,
             (string *)CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8));
  std::__cxx11::string::~string(local_910);
  std::__cxx11::string::~string(local_930);
  std::__cxx11::string::~string(local_978);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_951);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(local_18);
  local_9a1 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x109521);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffff3f0,CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8)
             ,(bool *)in_stack_fffffffffffff3e0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8));
  std::allocator<bool>::~allocator((allocator<bool> *)0x10954f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10955c);
  local_9c4 = 0;
  std::__cxx11::string::string(local_9e8);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_8f0,local_9e8);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!(bool)uVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff3e0,
                (value_type *)CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8));
    local_9ec = 0;
    local_9f8 = local_18;
    local_a00._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff3c8);
    local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff3c8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff3d0,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff3c8);
      if (!bVar2) break;
      local_a10 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_a00);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff414,in_stack_fffffffffffff410),
                 in_stack_fffffffffffff408,(flag_type)((ulong)in_stack_fffffffffffff400 >> 0x20));
      in_stack_fffffffffffff41e =
           std::
           regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                     (in_stack_fffffffffffff3e0,
                      (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                      CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),
                      (match_flag_type)((ulong)in_stack_fffffffffffff3d0 >> 0x20));
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (in_stack_fffffffffffff3d0);
      if ((in_stack_fffffffffffff41e & 1) != 0) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffff3f0,
                           CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
        in_stack_fffffffffffff408 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar6._M_mask;
        in_stack_fffffffffffff410 = rVar6._M_p._0_4_;
        in_stack_fffffffffffff414 = rVar6._M_p._4_4_;
        local_a40[0] = rVar6;
        std::_Bit_reference::operator=(local_a40,true);
      }
      local_9ec = local_9ec + 1;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_a00);
    }
    local_9c4 = local_9c4 + 1;
  }
  std::__cxx11::string::~string(local_9e8);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff3e0);
  if ((!bVar2) && (local_a44 = 0x40, 0x3f < local_9c4)) {
    std::__cxx11::stringstream::str();
    in_stack_fffffffffffff400 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<((ostream *)&std::clog,local_a68);
    poVar4 = std::operator<<((ostream *)in_stack_fffffffffffff400," | lines < MAX_ERROR_LINES_COUNT"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_a68);
    expect_fail__((char *)in_stack_fffffffffffff3d0,(char *)in_stack_fffffffffffff3c8,0);
  }
  this = &local_9a0;
  iVar7 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x109b7c);
  local_a98 = iVar7.super__Bit_iterator_base._M_p;
  local_a90 = iVar7.super__Bit_iterator_base._M_offset;
  local_a88 = local_a98;
  local_a80 = local_a90;
  iVar7 = std::vector<bool,_std::allocator<bool>_>::end(this);
  local_ab8 = iVar7.super__Bit_iterator_base._M_p;
  local_ab0 = iVar7.super__Bit_iterator_base._M_offset;
  local_ab9 = 0;
  __first.super__Bit_iterator_base._M_p._4_2_ = in_stack_fffffffffffff41c;
  __first.super__Bit_iterator_base._M_p._0_4_ = in_stack_fffffffffffff418;
  __first.super__Bit_iterator_base._M_p._6_1_ = in_stack_fffffffffffff41e;
  __first.super__Bit_iterator_base._M_p._7_1_ = uVar1;
  __first.super__Bit_iterator_base._8_8_ = piVar5;
  _Var8.super__Bit_iterator_base._M_offset = in_stack_fffffffffffff410;
  _Var8.super__Bit_iterator_base._M_p = (_Bit_type *)in_stack_fffffffffffff408;
  _Var8.super__Bit_iterator_base._12_4_ = in_stack_fffffffffffff414;
  local_aa8 = local_ab8;
  local_aa0 = local_ab0;
  _Var8 = std::find<std::_Bit_iterator,bool>(__first,_Var8,(bool *)in_stack_fffffffffffff400);
  local_ad0 = _Var8.super__Bit_iterator_base._M_p;
  local_ac8 = _Var8.super__Bit_iterator_base._M_offset;
  local_a78 = local_ad0;
  local_a70 = local_ac8;
  iVar7 = std::vector<bool,_std::allocator<bool>_>::end(&local_9a0);
  local_af0 = iVar7.super__Bit_iterator_base._M_p;
  local_ae8 = iVar7.super__Bit_iterator_base._M_offset;
  local_ae0 = local_af0;
  local_ad8 = local_ae8;
  bVar2 = std::operator!=((_Bit_iterator_base *)in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8)
  ;
  if (bVar2) {
    local_af8 = local_9c0;
    local_b00._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff3c8);
    local_b08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff3c8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff3d0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff3c8);
      if (!bVar2) break;
      local_b10 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_b00);
      in_stack_fffffffffffff3d0 =
           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
           std::operator<<((ostream *)&std::clog,(string *)local_b10);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffff3d0,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_b00);
    }
    std::__cxx11::stringstream::str();
    poVar4 = std::operator<<((ostream *)&std::clog,local_b30);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_b30);
    expect_fail__((char *)in_stack_fffffffffffff3d0,(char *)poVar4,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x109e08)
  ;
  file<std::basic_ifstream<char,_std::char_traits<char>_>_>::~file
            ((file<std::basic_ifstream<char,_std::char_traits<char>_>_> *)in_stack_fffffffffffff3d0)
  ;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

auto compail_fail(int id, const std::string& defines, const std::vector<std::string>& errors, const std::string& code) {
  std::stringstream command;
  {
    file<> source_code{std::string{"error"} + std::to_string(id) + ".cpp"};
    source_code << "#include <boost/di.hpp>" << std::endl;
    source_code << "namespace di = boost::di;" << std::endl;
    source_code << code;

    std::stringstream errors{};

#if defined(__CLANG__)
    errors << "-Werror";
#elif defined(__GCC__)
    errors << "-Werror";
#elif defined(__MSVC__)
    errors << "/EHsc /W3 /WX";
#endif

    const auto include_rgx = std::regex{"<include>"};

#if defined(__MSVC__)
    const auto include = std::regex_replace(defines, include_rgx, "/FI");
#else
    const auto include = std::regex_replace(defines, include_rgx, "-include");
#endif

    command << cxx() << " " << cxxflags(true) << " " << include << " " << errors.str() << " " << source_code
#if defined(__MSVC__)
            << " >"
#else
            << " 2>"
#endif
            << " error" << id << ".out";
  }

  std::clog << command.str() << std::endl;
  expect(std::system(command.str().c_str()));

  file<std::ifstream> output{std::string{"error"} + std::to_string(id) + ".out"};
  std::vector<bool> matches(errors.size(), false);
  std::vector<std::string> out;
  auto lines = 0;
  for (std::string line; std::getline(output, line);) {
    out.push_back(line);
    auto i = 0;
    for (const auto& rgx : errors) {
      if (std::regex_match(line, std::regex{rgx})) {
        matches[i] = true;
      }
      ++i;
    }
    ++lines;
  }

  if (!errors.empty()) {
#if defined(__MSVC__)
    constexpr auto MAX_ERROR_LINES_COUNT = 128;
#else
    constexpr auto MAX_ERROR_LINES_COUNT = 64;
#endif

    if (lines >= MAX_ERROR_LINES_COUNT) {
      std::clog << command.str() << " | lines < MAX_ERROR_LINES_COUNT" << std::endl;
      expect(false);
    }
  }

  if (std::find(matches.begin(), matches.end(), false) != matches.end()) {
    for (const auto& line : out) {
      std::clog << line << std::endl;
    }
    std::clog << command.str() << std::endl;
    expect(false);
  }
}
}